

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O0

bool __thiscall
TcpServer::notifyChangeEpoll
          (TcpServer *this,
          vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
          *changes)

{
  AutoMutex this_00;
  bool bVar1;
  reference ppVar2;
  iterator local_c8;
  pair<int,_EpollChangeOperation> *local_a8;
  __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
  local_a0;
  iterator local_98;
  const_iterator local_78;
  undefined4 local_58;
  pair<int,_EpollChangeOperation> local_48;
  pair<int,_EpollChangeOperation> c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
  *__range1;
  AutoMutex m;
  vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
  *changes_local;
  TcpServer *this_local;
  
  m.mutex = (MutexWrap *)changes;
  AutoMutex::AutoMutex((AutoMutex *)&__range1,&this->mutex);
  this_00.mutex = m.mutex;
  __end1 = std::
           vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           ::begin((vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
                    *)m.mutex);
  c = (pair<int,_EpollChangeOperation>)
      std::
      vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
      ::end((vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
             *)this_00.mutex);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
                                *)&c);
    if (!bVar1) {
      std::
      deque<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
      ::end(&local_98,&this->changesTempStorage);
      std::
      _Deque_iterator<std::pair<int,EpollChangeOperation>,std::pair<int,EpollChangeOperation>const&,std::pair<int,EpollChangeOperation>const*>
      ::
      _Deque_iterator<std::_Deque_iterator<std::pair<int,EpollChangeOperation>,std::pair<int,EpollChangeOperation>&,std::pair<int,EpollChangeOperation>*>,void>
                ((_Deque_iterator<std::pair<int,EpollChangeOperation>,std::pair<int,EpollChangeOperation>const&,std::pair<int,EpollChangeOperation>const*>
                  *)&local_78,&local_98);
      local_a0._M_current =
           (pair<int,_EpollChangeOperation> *)
           std::
           vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           ::begin((vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
                    *)m.mutex);
      local_a8 = (pair<int,_EpollChangeOperation> *)
                 std::
                 vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
                 ::end((vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
                        *)m.mutex);
      std::
      deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::pair<int,EpollChangeOperation>const*,std::vector<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>>,void>
                (&local_c8,
                 (deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>
                  *)&this->changesTempStorage,&local_78,local_a0,
                 (__normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
                  )local_a8);
      this_local._7_1_ = writePipeToNotify(this,'c');
LAB_00113241:
      local_58 = 1;
      AutoMutex::~AutoMutex((AutoMutex *)&__range1);
      return this_local._7_1_;
    }
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
             ::operator*(&__end1);
    local_48 = *ppVar2;
    bVar1 = isVaildConnection(this,local_48.first);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00113241;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool notifyChangeEpoll(
      const std::vector<std::pair<int, EpollChangeOperation>> &changes) {
    AutoMutex m(mutex);
    for (auto c : changes) {
      if (!isVaildConnection(c.first)) {
        return false;
      }
    }
    changesTempStorage.insert(changesTempStorage.end(), changes.begin(),
                              changes.end());
    return writePipeToNotify('c');
  }